

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_text(nk_command_buffer *b,nk_rect r,char *string,int length,nk_user_font *font,
                 nk_color bg,nk_color fg)

{
  void *pvVar1;
  nk_command_buffer *in_RCX;
  int in_EDX;
  float *in_RSI;
  int *in_RDI;
  int in_R8D;
  float in_R9D;
  float in_XMM0_Da;
  float t;
  float in_XMM0_Db;
  float in_XMM1_Da;
  float in_XMM1_Db;
  float txt_width;
  int glyphs;
  nk_rect *c;
  nk_command_text *cmd;
  float text_width;
  nk_size in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd0;
  char *text;
  nk_user_font *font_00;
  
  text = (char *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  font_00 = (nk_user_font *)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  if ((((in_RDI != (int *)0x0) && (in_RSI != (float *)0x0)) && (in_EDX != 0)) &&
     (((char)((uint)in_R8D >> 0x18) != '\0' || ((char)((uint)in_R9D >> 0x18) != '\0')))) {
    if (in_RDI[6] != 0) {
      if (((float)in_RDI[4] == 0.0) && (!NAN((float)in_RDI[4]))) {
        return;
      }
      if (((float)in_RDI[5] == 0.0) && (!NAN((float)in_RDI[5]))) {
        return;
      }
      if (in_XMM0_Da + in_XMM1_Da <= (float)in_RDI[2]) {
        return;
      }
      if ((float)in_RDI[2] + (float)in_RDI[4] <= in_XMM0_Da) {
        return;
      }
      if (in_XMM0_Db + in_XMM1_Db <= (float)in_RDI[3]) {
        return;
      }
      if ((float)in_RDI[3] + (float)in_RDI[5] <= in_XMM0_Db) {
        return;
      }
    }
    t = (float)(**(code **)&(in_RCX->clip).w)((in_RCX->clip).x,in_RCX->base,in_RSI,in_EDX);
    if (SUB84(font_00,0) < t) {
      in_EDX = nk_text_clamp(font_00,text,in_R8D,in_R9D,in_RDI,in_RSI,
                             (nk_rune *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),(int)txt_width);
    }
    if ((in_EDX != 0) &&
       (pvVar1 = nk_command_buffer_push(in_RCX,(nk_command_type)t,in_stack_ffffffffffffffb8),
       pvVar1 != (void *)0x0)) {
      *(short *)((long)pvVar1 + 0x20) = (short)(int)SUB84(text,0);
      *(short *)((long)pvVar1 + 0x22) = (short)(int)(float)((ulong)text >> 0x20);
      *(short *)((long)pvVar1 + 0x24) = (short)(int)SUB84(font_00,0);
      *(short *)((long)pvVar1 + 0x26) = (short)(int)(float)((ulong)font_00 >> 0x20);
      *(int *)((long)pvVar1 + 0x18) = in_R8D;
      *(float *)((long)pvVar1 + 0x1c) = in_R9D;
      *(nk_command_buffer **)((long)pvVar1 + 0x10) = in_RCX;
      *(int *)((long)pvVar1 + 0x2c) = in_EDX;
      *(float *)((long)pvVar1 + 0x28) = (in_RCX->clip).x;
      nk_memcopy((void *)((long)pvVar1 + 0x30),in_RSI,(long)in_EDX);
      *(undefined1 *)((long)pvVar1 + (long)in_EDX + 0x30) = 0;
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_text(struct nk_command_buffer *b, struct nk_rect r,
const char *string, int length, const struct nk_user_font *font,
struct nk_color bg, struct nk_color fg)
{
float text_width = 0;
struct nk_command_text *cmd;

NK_ASSERT(b);
NK_ASSERT(font);
if (!b || !string || !length || (bg.a == 0 && fg.a == 0)) return;
if (b->use_clipping) {
const struct nk_rect *c = &b->clip;
if (c->w == 0 || c->h == 0 || !NK_INTERSECT(r.x, r.y, r.w, r.h, c->x, c->y, c->w, c->h))
return;
}

/* make sure text fits inside bounds */
text_width = font->width(font->userdata, font->height, string, length);
if (text_width > r.w){
int glyphs = 0;
float txt_width = (float)text_width;
length = nk_text_clamp(font, string, length, r.w, &glyphs, &txt_width, 0,0);
}

if (!length) return;
cmd = (struct nk_command_text*)
nk_command_buffer_push(b, NK_COMMAND_TEXT, sizeof(*cmd) + (nk_size)(length + 1));
if (!cmd) return;
cmd->x = (short)r.x;
cmd->y = (short)r.y;
cmd->w = (unsigned short)r.w;
cmd->h = (unsigned short)r.h;
cmd->background = bg;
cmd->foreground = fg;
cmd->font = font;
cmd->length = length;
cmd->height = font->height;
NK_MEMCPY(cmd->string, string, (nk_size)length);
cmd->string[length] = '\0';
}